

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscopedpointer.h
# Opt level: O3

void __thiscall QGraphicsProxyWidget::focusOutEvent(QGraphicsProxyWidget *this,QFocusEvent *event)

{
  long lVar1;
  FocusReason reason;
  QWidget *pQVar2;
  
  lVar1 = *(long *)(*(long *)(this + 0x18) + 0x208);
  if (((lVar1 != 0) && (*(int *)(lVar1 + 4) != 0)) &&
     (pQVar2 = *(QWidget **)(*(long *)(this + 0x18) + 0x210), pQVar2 != (QWidget *)0x0)) {
    pQVar2 = QWidget::focusWidget(pQVar2);
    if (pQVar2 != (QWidget *)0x0) {
      if ((pQVar2->data->widget_attributes & 0x4000) != 0) {
        QGuiApplication::inputMethod();
        QInputMethod::reset();
      }
      reason = QFocusEvent::reason();
      QGraphicsProxyWidgetPrivate::removeSubFocusHelper
                ((QGraphicsProxyWidgetPrivate *)event,pQVar2,reason);
      return;
    }
  }
  return;
}

Assistant:

T *data() const noexcept
    {
        return d;
    }